

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosStream.cpp
# Opt level: O0

void __thiscall
adiosStream::adiosStream
          (adiosStream *this,string *streamName,IO *io,Mode mode,MPI_Comm comm,bool iotimer,
          size_t appid)

{
  char *pcVar1;
  FILE *__n;
  ostream *this_00;
  double *pdVar2;
  char *__s;
  int in_ECX;
  string *in_RDX;
  Mode in_ESI;
  undefined8 *in_RDI;
  char *in_R8;
  byte in_R9B;
  undefined8 in_stack_00000008;
  string content;
  int i;
  string logfilename;
  vector<double,_std::allocator<double>_> opentime_all_ranks;
  double timeEnd;
  double timeStart;
  int totalRanks;
  int myRank;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  string *in_stack_fffffffffffffdb8;
  Stream *in_stack_fffffffffffffdc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [36];
  int local_e4;
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  vector<double,_std::allocator<double>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  undefined8 local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  double local_50;
  int local_34;
  int local_30;
  byte local_29;
  char *local_28;
  int local_1c;
  string *local_18;
  Mode local_10;
  
  local_29 = in_R9B & 1;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_ESI;
  Stream::Stream(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                 (Mode)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
  *in_RDI = &PTR__adiosStream_00156ca0;
  adios2::Engine::Engine((Engine *)(in_RDI + 6));
  in_RDI[7] = *(undefined8 *)local_18;
  in_RDI[10] = local_28;
  MPI_Comm_rank(local_28,&local_30);
  MPI_Comm_size(local_28,&local_34);
  *(byte *)(in_RDI + 8) = local_29 & 1;
  in_RDI[9] = in_stack_00000008;
  if (local_1c == 1) {
    local_50 = (double)MPI_Wtime();
    local_60 = adios2::IO::Open(local_18,local_10,(ompi_communicator_t *)0x1);
    in_RDI[6] = local_60;
    in_stack_fffffffffffffdf8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)MPI_Wtime();
    local_58 = in_stack_fffffffffffffdf8;
  }
  else {
    local_50 = (double)MPI_Wtime();
    in_stack_fffffffffffffde8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         adios2::IO::Open(local_18,local_10,(ompi_communicator_t *)0x2);
    in_RDI[6] = in_stack_fffffffffffffde8;
    local_68 = in_stack_fffffffffffffde8;
    in_stack_fffffffffffffde0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)MPI_Wtime();
    local_58 = in_stack_fffffffffffffde0;
  }
  if ((*(byte *)(in_RDI + 8) & 1) != 0) {
    in_RDI[0xc] = (double)local_58 - local_50;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x134339);
    if (local_30 == 0) {
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffde8);
      std::operator+((char *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      std::operator+(in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string(local_e0);
      pcVar1 = (char *)std::__cxx11::string::c_str();
      __n = fopen(pcVar1,"w");
      in_RDI[0xb] = __n;
      fputs("step,rank,operation,time\n",(FILE *)in_RDI[0xb]);
      this_00 = std::operator<<((ostream *)&std::cout,"performance log file open succeeded!");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      std::vector<double,_std::allocator<double>_>::reserve
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffde0,(size_type)__n
                );
      std::__cxx11::string::~string(local_a0);
    }
    pdVar2 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x1344f1);
    MPI_Gather(in_RDI + 0xc,1,&ompi_mpi_double,pdVar2,1,&ompi_mpi_double,0);
    if (local_30 == 0) {
      pcVar1 = local_28;
      for (local_e4 = 0; local_e4 < local_34; local_e4 = local_e4 + 1) {
        in_stack_fffffffffffffdc0 = (Stream *)adios2::Engine::CurrentStep();
        std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffde8);
        std::operator+(in_stack_fffffffffffffdb8,pcVar1);
        std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
        std::operator+(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
        std::operator+(in_stack_fffffffffffffdb8,pcVar1);
        std::vector<double,_std::allocator<double>_>::operator[](&local_80,(long)local_e4);
        std::__cxx11::to_string((double)in_stack_fffffffffffffdb8);
        std::operator+(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
        std::operator+(in_stack_fffffffffffffdb8,pcVar1);
        std::__cxx11::string::~string(local_128);
        std::__cxx11::string::~string(local_1e8);
        std::__cxx11::string::~string(local_148);
        std::__cxx11::string::~string(local_168);
        std::__cxx11::string::~string(local_1c8);
        std::__cxx11::string::~string(local_188);
        std::__cxx11::string::~string(local_1a8);
        __s = (char *)std::__cxx11::string::c_str();
        fputs(__s,(FILE *)in_RDI[0xb]);
        std::__cxx11::string::~string(local_108);
      }
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc0);
  }
  return;
}

Assistant:

adiosStream::adiosStream(const std::string &streamName, adios2::IO &io, const adios2::Mode mode,
                         MPI_Comm comm, bool iotimer, size_t appid)
: Stream(streamName, mode), io(io), comm(comm)
{
    int myRank, totalRanks;
    MPI_Comm_rank(comm, &myRank);
    MPI_Comm_size(comm, &totalRanks);
    double timeStart, timeEnd;

    // double maxOpenTime, minOpenTime;
    hasIOTimer = iotimer;
    appID = appid;

    if (mode == adios2::Mode::Write)
    {
        timeStart = MPI_Wtime();
        engine = io.Open(streamName, adios2::Mode::Write, comm);
        timeEnd = MPI_Wtime();
    }
    else
    {
        timeStart = MPI_Wtime();
        engine = io.Open(streamName, adios2::Mode::Read, comm);
        timeEnd = MPI_Wtime();
    }
    if (hasIOTimer)
    {
        openTime = timeEnd - timeStart;
        std::vector<double> opentime_all_ranks;
        if (myRank == 0)
        {
            std::string logfilename = "app" + std::to_string(appID) + "_perf.csv";
            perfLogFP = fopen(logfilename.c_str(), "w");
            fputs("step,rank,operation,time\n", perfLogFP);
            std::cout << "performance log file open succeeded!" << std::endl;
            opentime_all_ranks.reserve(totalRanks);
        }
        MPI_Gather(&openTime, 1, MPI_DOUBLE, opentime_all_ranks.data(), 1, MPI_DOUBLE, 0, comm);
        if (myRank == 0)
        {
            for (int i = 0; i < totalRanks; i++)
            {
                std::string content = std::to_string(engine.CurrentStep()) + "," +
                                      std::to_string(i) + ",open," +
                                      std::to_string(opentime_all_ranks[i]) + "\n";
                // std::cout << content;
                fputs(content.c_str(), perfLogFP);
            }
        }
    }
    // openTime = timeEnd - timeStart;
    // MPI_Allreduce(&openTime, &maxOpenTime, 1, MPI_DOUBLE, MPI_MAX, comm);
    // MPI_Allreduce(&openTime, &minOpenTime, 1, MPI_DOUBLE, MPI_MIN, comm);
    // if (myRank == 0)
    // {
    //     std::cout << "        Max open time = " << maxOpenTime << std::endl;
    //     std::cout << "        Min open time = " << minOpenTime << std::endl;
    //     std::ofstream open_perf_log;
    //     open_perf_log.open("open_perf.txt", std::ios::app);
    //     open_perf_log << std::to_string(maxOpenTime) + ", " +
    //                          std::to_string(minOpenTime) + "\n";
    //     open_perf_log.close();
    // }
}